

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

Roaring64Map * __thiscall roaring::Roaring64Map::operator&(Roaring64Map *this,Roaring64Map *o)

{
  Roaring64Map *in_RSI;
  Roaring64Map *in_RDI;
  Roaring64Map *this_00;
  Roaring64Map *this_01;
  
  this_00 = in_RDI;
  this_01 = in_RDI;
  Roaring64Map(in_RDI,in_RDI);
  operator&=(this_01,in_RSI);
  Roaring64Map(this_00,in_RDI);
  ~Roaring64Map((Roaring64Map *)0x114843);
  return this_00;
}

Assistant:

Roaring64Map operator&(const Roaring64Map &o) const {
        return Roaring64Map(*this) &= o;
    }